

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O3

InputGraph read_file_format(string *format,string *filename)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  GraphFileError *pGVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string *in_RDX;
  string actual_format;
  ifstream infile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&local_238,(string *)in_RDX,_S_in);
  paVar6 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar6;
  if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0) {
    pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"unable to open file","");
    GraphFileError::GraphFileError(pGVar4,in_RDX,&local_298,false);
    __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar1,pcVar1 + filename->_M_string_length);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_298,"auto");
  if (iVar2 == 0) {
    detect_format(&local_278,(ifstream *)&local_238,in_RDX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_298,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::ios::clear((int)&local_238 + (int)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18));
    plVar3 = (long *)std::istream::seekg((long)&local_238,_S_beg);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,
                 "unable to seek on input file (try specifying file format explicitly)","");
      GraphFileError::GraphFileError(pGVar4,in_RDX,&local_278,true);
      __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_298,"dimacs");
  if (iVar2 == 0) {
    read_dimacs((ifstream *)format,&local_238);
  }
  else {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_298,"lad");
    if (iVar2 == 0) {
      read_lad((ifstream *)format,&local_238);
    }
    else {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_298,"directedlad");
      if (iVar2 == 0) {
        read_directed_lad((ifstream *)format,&local_238);
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_298,"labelledlad");
        if (iVar2 == 0) {
          read_labelled_lad((ifstream *)format,&local_238);
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_298,"vertexlabelledlad");
          if (iVar2 == 0) {
            read_vertex_labelled_lad((ifstream *)format,&local_238);
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_298,"csv");
            if (iVar2 == 0) {
              read_csv((istream *)format,&local_238);
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_298,"vfmcs");
              if (iVar2 == 0) {
                read_unlabelled_undirected_vfmcs((ifstream *)format,&local_238);
              }
              else {
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_298,"vfmcsv");
                if (iVar2 == 0) {
                  read_vertex_labelled_undirected_vfmcs((ifstream *)format,&local_238);
                }
                else {
                  iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_298,"vfmcsvd");
                  if (iVar2 == 0) {
                    read_vertex_labelled_directed_vfmcs((ifstream *)format,&local_238);
                  }
                  else {
                    iVar2 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_298,0,8,"csvname:");
                    if (iVar2 != 0) {
                      pGVar4 = (GraphFileError *)__cxa_allocate_exception(0x30);
                      std::operator+(&local_258,"Unknown file format \'",filename);
                      pbVar5 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_258,"\'");
                      paVar6 = &pbVar5->field_2;
                      local_278._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_278._M_dataplus._M_p == paVar6) {
                        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                        local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
                        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
                      }
                      else {
                        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
                      }
                      local_278._M_string_length = pbVar5->_M_string_length;
                      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
                      pbVar5->_M_string_length = 0;
                      (pbVar5->field_2)._M_local_buf[0] = '\0';
                      GraphFileError::GraphFileError(pGVar4,in_RDX,&local_278,true);
                      __cxa_throw(pGVar4,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&local_278,&local_298,8,0xffffffffffffffff);
                    read_csv_name((istream *)format,&local_238,in_RDX);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_278._M_dataplus._M_p != &local_278.field_2) {
                      operator_delete(local_278._M_dataplus._M_p,
                                      local_278.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar6) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&local_238);
  return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
         (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)format;
}

Assistant:

auto read_file_format(const string & format, const string & filename) -> InputGraph
{
    ifstream infile{filename};
    if (! infile)
        throw GraphFileError{filename, "unable to open file", false};

    auto actual_format = format;
    if (actual_format == "auto") {
        actual_format = detect_format(infile, filename);
        infile.clear();
        if (! infile.seekg(0, ios::beg))
            throw GraphFileError{filename, "unable to seek on input file (try specifying file format explicitly)", true};
    }

    if (actual_format == "dimacs")
        return read_dimacs(move(infile), filename);
    else if (actual_format == "lad")
        return read_lad(move(infile), filename);
    else if (actual_format == "directedlad")
        return read_directed_lad(move(infile), filename);
    else if (actual_format == "labelledlad")
        return read_labelled_lad(move(infile), filename);
    else if (actual_format == "vertexlabelledlad")
        return read_vertex_labelled_lad(move(infile), filename);
    else if (actual_format == "csv")
        return read_csv(move(infile), filename);
    else if (actual_format == "vfmcs")
        return read_unlabelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsv")
        return read_vertex_labelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsvd")
        return read_vertex_labelled_directed_vfmcs(move(infile), filename);
    else if (0 == actual_format.compare(0, 8, "csvname:"))
        return read_csv_name(move(infile), filename, actual_format.substr(8));
    else
        throw GraphFileError{filename, "Unknown file format '" + format + "'", true};
}